

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jdouble Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rho1_1get
                  (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  double result;
  opt_s *arg1;
  jdouble jresult;
  jobject jarg1__local;
  jlong jarg1_local;
  jclass jcls_local;
  JNIEnv *jenv_local;
  
  return *(jdouble *)(jarg1 + 0x68);
}

Assistant:

SWIGEXPORT jdouble JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1rho1_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jdouble jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  double result;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (double) ((arg1)->rho1);
  jresult = (jdouble)result; 
  return jresult;
}